

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterproperties.cpp
# Opt level: O2

void icu_63::CharacterProperties::initInclusion(UPropertySource src,UErrorCode *errorCode)

{
  UnicodeSet *this;
  Normalizer2Impl *pNVar1;
  USetAdder *sa;
  undefined8 *puVar2;
  USetAdder local_50;
  
  if (src == UPROPS_SRC_NONE) {
    *errorCode = U_INTERNAL_PROGRAM_ERROR;
    return;
  }
  puVar2 = &::(anonymous_namespace)::gInclusions + (ulong)src * 2;
  local_50.set = (USet *)UMemory::operator_new((UMemory *)0x58,(size_t)errorCode);
  if ((UnicodeSet *)local_50.set == (UnicodeSet *)0x0) {
    *puVar2 = 0;
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    return;
  }
  UnicodeSet::UnicodeSet((UnicodeSet *)local_50.set);
  *puVar2 = local_50.set;
  local_50.add = anon_unknown.dwarf_3669b4::_set_add;
  local_50.addRange = anon_unknown.dwarf_3669b4::_set_addRange;
  local_50.addString = anon_unknown.dwarf_3669b4::_set_addString;
  local_50.remove = (undefined1 *)0x0;
  local_50.removeRange = (undefined1 *)0x0;
  sa = (USetAdder *)0xc00;
  UnicodeSet::ensureCapacity((UnicodeSet *)local_50.set,0xc00,errorCode);
  switch(src) {
  case UPROPS_SRC_CHAR:
    sa = (USetAdder *)errorCode;
    uchar_addPropertyStarts_63(&local_50,errorCode);
    break;
  case UPROPS_SRC_PROPSVEC:
    goto LAB_002f7c3a;
  default:
    *errorCode = U_INTERNAL_PROGRAM_ERROR;
    goto LAB_002f7c99;
  case UPROPS_SRC_BIDI:
    sa = (USetAdder *)errorCode;
    ubidi_addPropertyStarts_63(&local_50,errorCode);
    break;
  case UPROPS_SRC_CHAR_AND_PROPSVEC:
    uchar_addPropertyStarts_63(&local_50,errorCode);
LAB_002f7c3a:
    sa = (USetAdder *)errorCode;
    upropsvec_addPropertyStarts_63(&local_50,errorCode);
    break;
  case UPROPS_SRC_CASE_AND_NORM:
    pNVar1 = Normalizer2Factory::getNFCImpl(errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      Normalizer2Impl::addPropertyStarts(pNVar1,&local_50,errorCode);
    }
  case UPROPS_SRC_CASE:
    sa = (USetAdder *)errorCode;
    ucase_addPropertyStarts_63(&local_50,errorCode);
    break;
  case UPROPS_SRC_NFC:
    pNVar1 = Normalizer2Factory::getNFCImpl(errorCode);
    goto LAB_002f7c7f;
  case UPROPS_SRC_NFKC:
    pNVar1 = Normalizer2Factory::getNFKCImpl(errorCode);
    goto LAB_002f7c7f;
  case UPROPS_SRC_NFKC_CF:
    pNVar1 = Normalizer2Factory::getNFKC_CFImpl(errorCode);
LAB_002f7c7f:
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      sa = &local_50;
      Normalizer2Impl::addPropertyStarts(pNVar1,sa,errorCode);
      break;
    }
    goto LAB_002f7c99;
  case UPROPS_SRC_NFC_CANON_ITER:
    pNVar1 = Normalizer2Factory::getNFCImpl(errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      sa = &local_50;
      Normalizer2Impl::addCanonIterPropertyStarts(pNVar1,sa,errorCode);
      break;
    }
    goto LAB_002f7c99;
  case UPROPS_SRC_INPC:
  case UPROPS_SRC_INSC:
  case UPROPS_SRC_VO:
    sa = &local_50;
    uprops_addPropertyStarts_63(src,sa,errorCode);
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeSet::compact((UnicodeSet *)*puVar2);
    ucln_common_registerCleanup_63
              (UCLN_COMMON_CHARACTERPROPERTIES,
               anon_unknown.dwarf_3669b4::characterproperties_cleanup);
  }
  else {
LAB_002f7c99:
    this = (UnicodeSet *)*puVar2;
    if (this != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(this);
    }
    UMemory::operator_delete((UMemory *)this,sa);
    *puVar2 = 0;
  }
  return;
}

Assistant:

void U_CALLCONV CharacterProperties::initInclusion(UPropertySource src, UErrorCode &errorCode) {
    // This function is invoked only via umtx_initOnce().
    // This function is a friend of class UnicodeSet.

    U_ASSERT(0 <= src && src < UPROPS_SRC_COUNT);
    if (src == UPROPS_SRC_NONE) {
        errorCode = U_INTERNAL_PROGRAM_ERROR;
        return;
    }
    UnicodeSet * &incl = gInclusions[src].fSet;
    U_ASSERT(incl == nullptr);

    incl = new UnicodeSet();
    if (incl == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    USetAdder sa = {
        (USet *)incl,
        _set_add,
        _set_addRange,
        _set_addString,
        nullptr, // don't need remove()
        nullptr // don't need removeRange()
    };

    incl->ensureCapacity(DEFAULT_INCLUSION_CAPACITY, errorCode);
    switch(src) {
    case UPROPS_SRC_CHAR:
        uchar_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_PROPSVEC:
        upropsvec_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_CHAR_AND_PROPSVEC:
        uchar_addPropertyStarts(&sa, &errorCode);
        upropsvec_addPropertyStarts(&sa, &errorCode);
        break;
#if !UCONFIG_NO_NORMALIZATION
    case UPROPS_SRC_CASE_AND_NORM: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        ucase_addPropertyStarts(&sa, &errorCode);
        break;
    }
    case UPROPS_SRC_NFC: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        break;
    }
    case UPROPS_SRC_NFKC: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFKCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        break;
    }
    case UPROPS_SRC_NFKC_CF: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFKC_CFImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addPropertyStarts(&sa, errorCode);
        }
        break;
    }
    case UPROPS_SRC_NFC_CANON_ITER: {
        const Normalizer2Impl *impl=Normalizer2Factory::getNFCImpl(errorCode);
        if(U_SUCCESS(errorCode)) {
            impl->addCanonIterPropertyStarts(&sa, errorCode);
        }
        break;
    }
#endif
    case UPROPS_SRC_CASE:
        ucase_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_BIDI:
        ubidi_addPropertyStarts(&sa, &errorCode);
        break;
    case UPROPS_SRC_INPC:
    case UPROPS_SRC_INSC:
    case UPROPS_SRC_VO:
        uprops_addPropertyStarts((UPropertySource)src, &sa, &errorCode);
        break;
    default:
        errorCode = U_INTERNAL_PROGRAM_ERROR;
        break;
    }

    if (U_FAILURE(errorCode)) {
        delete incl;
        incl = nullptr;
        return;
    }
    // Compact for caching
    incl->compact();
    ucln_common_registerCleanup(UCLN_COMMON_CHARACTERPROPERTIES, characterproperties_cleanup);
}